

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

size_t __thiscall proto2_unittest::OpenEnumMessage::ByteSizeLong(OpenEnumMessage *this)

{
  RepeatedField<int> *pRVar1;
  long lVar2;
  anon_union_48_1_493b367e_for_OpenEnumMessage_11 aVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  
  pRVar1 = &(this->field_0)._impl_.repeated_open_;
  sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar1);
  uVar4 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,
                     (undefined1  [48])((undefined1  [48])this->field_0 & (undefined1  [48])0x4) ==
                     (undefined1  [48])0x0);
  pRVar1 = &(this->field_0)._impl_.repeated_closed_;
  sVar7 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar1);
  uVar5 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x18) & 4) == 0);
  sVar6 = sVar7 + sVar6 + (ulong)uVar4 + (ulong)uVar5;
  aVar3 = this->field_0;
  if (((undefined1  [48])aVar3 & (undefined1  [48])0x3) != (undefined1  [48])0x0) {
    if (((undefined1  [48])aVar3 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
      uVar8 = (long)(this->field_0)._impl_.opt_open_ | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [48])aVar3 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
      uVar8 = (long)(this->field_0)._impl_.opt_closed_ | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar6 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t OpenEnumMessage::ByteSizeLong() const {
  const OpenEnumMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.OpenEnumMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.OpenEnumMessage.TestEnum repeated_open = 3;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_open());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_open_size());
      total_size += data_size + tag_size;
    }
    // repeated .proto2_unittest.ForeignEnum repeated_closed = 4;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_closed());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_closed_size());
      total_size += data_size + tag_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .proto2_unittest.OpenEnumMessage.TestEnum opt_open = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_opt_open());
    }
    // .proto2_unittest.ForeignEnum opt_closed = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_opt_closed());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}